

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVm.cpp
# Opt level: O2

bool IsPhiUsed(VmInstruction *phi,uint searchMarker)

{
  bool bVar1;
  VmValue **ppVVar2;
  VmInstruction *phi_00;
  uint userPos;
  uint index;
  bool bVar3;
  
  if (phi->cmd != VM_INST_PHI) {
    __assert_fail("phi->cmd == VM_INST_PHI",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                  ,0x1782,"bool IsPhiUsed(VmInstruction *, unsigned int)");
  }
  index = 0;
  bVar3 = false;
  if (phi->regVmSearchMarker != searchMarker) {
    phi->regVmSearchMarker = searchMarker;
    do {
      bVar3 = index < (phi->super_VmValue).users.count;
      if (!bVar3) {
        return bVar3;
      }
      ppVVar2 = SmallArray<VmValue_*,_8U>::operator[](&(phi->super_VmValue).users,index);
      phi_00 = (VmInstruction *)*ppVVar2;
      if ((phi_00 == (VmInstruction *)0x0) || ((phi_00->super_VmValue).typeID != 2)) {
        phi_00 = (VmInstruction *)0x0;
      }
      if (phi_00->cmd != VM_INST_PHI) {
        return bVar3;
      }
      bVar1 = IsPhiUsed(phi_00,searchMarker);
      index = index + 1;
    } while (!bVar1);
  }
  return bVar3;
}

Assistant:

bool IsPhiUsed(VmInstruction *phi, unsigned searchMarker)
{
	assert(phi->cmd == VM_INST_PHI);

	if(phi->regVmSearchMarker == searchMarker)
		return false;

	phi->regVmSearchMarker = searchMarker;

	for(unsigned userPos = 0; userPos < phi->users.size(); userPos++)
	{
		VmInstruction *instruction = getType<VmInstruction>(phi->users[userPos]);

		if(instruction->cmd == VM_INST_PHI)
		{
			if(IsPhiUsed(instruction, searchMarker))
				return true;
		}
		else
		{
			return true;
		}
	}

	return false;
}